

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O1

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand_(compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          *this)

{
  pointer puVar1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong slot_id;
  this_type new_ht;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  __tmp;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_320;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_1a8;
  
  compact_fkhash_trie(&local_320,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_,0);
  uVar5 = (this->capa_size_).mask_;
  if (uVar5 != 0xffffffffffffffff) {
    slot_id = 0;
    do {
      puVar1 = (this->ids_).chunks_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (this->ids_).width_;
      uVar7 = uVar3 * slot_id;
      uVar9 = (ulong)((uint)uVar7 & 0x3f);
      uVar11 = puVar1[uVar7 >> 6];
      if (uVar3 + uVar9 < 0x41) {
        uVar11 = uVar11 >> uVar9;
      }
      else {
        bVar2 = (byte)uVar7 & 0x3f;
        uVar11 = uVar11 >> bVar2 | puVar1[(uVar7 >> 6) + 1] << 0x40 - bVar2;
      }
      uVar11 = uVar11 & (this->ids_).mask_;
      if (uVar11 != uVar5) {
        uVar3 = get_dsp_(this,slot_id);
        uVar5 = (this->table_).size_;
        uVar4 = get_quo_(this,slot_id);
        uVar7 = (slot_id - uVar3) + uVar5;
        if (uVar3 <= slot_id) {
          uVar7 = slot_id - uVar3;
        }
        uVar5 = bijective_hash::split_mix_hasher::hash_inv
                          (&this->hasher_,
                           uVar4 << ((ulong)(byte)(this->capa_size_).bits_ & 0x3f) | uVar7);
        lVar6 = (ulong)local_320.hasher_.univ_size_.bits_ * 0x30;
        uVar7 = (uVar5 >> ((ulong)(byte)local_320.hasher_.shift_ & 0x3f) ^ uVar5) *
                *(long *)(bijective_hash::PRIME_TABLE + lVar6) & local_320.hasher_.univ_size_.mask_;
        uVar7 = (uVar7 >> ((ulong)((byte)local_320.hasher_.shift_ + 1) & 0x3f) ^ uVar7) *
                *(long *)(bijective_hash::PRIME_TABLE + lVar6 + 8) &
                local_320.hasher_.univ_size_.mask_;
        uVar9 = (uVar7 >> ((ulong)(byte)((byte)local_320.hasher_.shift_ + 2) & 0x3f) ^ uVar7) *
                *(long *)(bijective_hash::PRIME_TABLE + lVar6 + 0x10) &
                local_320.hasher_.univ_size_.mask_;
        uVar5 = 0;
        uVar7 = uVar9;
        while( true ) {
          uVar7 = uVar7 & local_320.capa_size_.mask_;
          uVar8 = local_320.ids_.width_ * uVar7;
          uVar10 = (ulong)((uint)uVar8 & 0x3f);
          if (uVar10 + local_320.ids_.width_ < 0x41) {
            uVar8 = local_320.ids_.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8 >> 6] >> uVar10;
          }
          else {
            bVar2 = (byte)uVar8 & 0x3f;
            uVar8 = local_320.ids_.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8 >> 6] >> bVar2 |
                    local_320.ids_.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[(uVar8 >> 6) + 1] << 0x40 - bVar2;
          }
          if ((uVar8 & local_320.ids_.mask_) == local_320.capa_size_.mask_) break;
          uVar7 = uVar7 + 1;
          uVar5 = uVar5 + 1;
        }
        update_slot_(&local_320,uVar7,uVar9 >> ((ulong)local_320.capa_size_.bits_ & 0x3f),uVar5,
                     uVar11);
      }
      slot_id = slot_id + 1;
      uVar5 = (this->capa_size_).mask_;
    } while (slot_id < uVar5 + 1);
  }
  local_320.size_ = this->size_;
  compact_fkhash_trie(&local_1a8,this);
  operator=(this,&local_320);
  operator=(&local_320,&local_1a8);
  ~compact_fkhash_trie(&local_1a8);
  ~compact_fkhash_trie(&local_320);
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < capa_size_.size(); ++i) {
            uint64_t node_id = ids_[i];

            if (node_id == capa_size_.mask()) {
                // encounter an empty slot
                continue;
            }

            uint64_t dist = get_dsp_(i);
            uint64_t init_id = dist <= i ? i - dist : table_.size() - (dist - i);
            uint64_t key = hasher_.hash_inv(get_quo_(i) << capa_size_.bits() | init_id);

            auto [quo, mod] = new_ht.decompose_(new_ht.hasher_.hash(key));

            for (uint64_t new_i = mod, cnt = 0;; new_i = new_ht.right_(new_i), ++cnt) {
                if (new_ht.ids_[new_i] == new_ht.capa_size_.mask()) {
                    // encounter an empty slot
                    new_ht.update_slot_(new_i, quo, cnt, node_id);
                    break;
                }
            }
        }

        new_ht.size_ = size_;
        std::swap(*this, new_ht);
    }